

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int print_ts2cb(char *fn)

{
  int iVar1;
  uint local_2c;
  uint32 local_28;
  uint32 i;
  uint32 n_cb;
  uint32 n_ts;
  uint32 *map;
  char *fn_local;
  
  map = (uint32 *)fn;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0x60,"Reading %s\n",fn);
  iVar1 = s3ts2cb_read((char *)map,(uint32 **)&n_cb,&i,&local_28);
  if (iVar1 == 0) {
    for (local_2c = 0; local_2c < i; local_2c = local_2c + 1) {
      printf("%d: %d\n",(ulong)local_2c,(ulong)_n_cb[local_2c]);
    }
    fn_local._4_4_ = 0;
  }
  else {
    fn_local._4_4_ = -1;
  }
  return fn_local._4_4_;
}

Assistant:

int
print_ts2cb(const char *fn)
{
    uint32 *map;
    uint32 n_ts, n_cb;
    uint32 i;

    E_INFO("Reading %s\n",  fn);

    if (s3ts2cb_read(fn, &map, &n_ts, &n_cb) != S3_SUCCESS)
	return S3_ERROR;

    for (i = 0; i < n_ts; i++) {
	printf("%d: %d\n", i, map[i]);
    }

    return S3_SUCCESS;
}